

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::handleCoopMat2FunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermTyped *result,
          TIntermNode *arguments)

{
  TIntermediate *this_00;
  TSymbolTable *pTVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  long *plVar7;
  TString *pTVar8;
  TInfoSink *name;
  TSymbol *pTVar9;
  undefined4 extraout_var_01;
  long lVar10;
  long *plVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TType *pTVar12;
  TType *right;
  long *plVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TArraySizes *pTVar14;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  _func_int **pp_Var15;
  undefined4 extraout_var_26;
  uint uVar16;
  int i;
  uint uVar17;
  char *pcVar18;
  ulong uVar19;
  TIntermNode *pTVar20;
  undefined1 auVar21 [16];
  TTypeParameters local_e0;
  TType resultType;
  
  name = (TInfoSink *)loc;
  if ((arguments != (TIntermNode *)0x0) &&
     (iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments), CONCAT44(extraout_var,iVar4) != 0)) {
    iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 400))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    uVar16 = 0;
    while( true ) {
      if ((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) >> 3) <= (ulong)uVar16) break;
      plVar13 = *(long **)(*(long *)(lVar6 + 8) + (ulong)uVar16 * 8);
      plVar7 = (long *)(**(code **)(*plVar13 + 0x18))(plVar13);
      iVar4 = (**(code **)(*plVar7 + 0x100))(plVar7);
      if (iVar4 == 0x16) {
        name = (this->super_TParseContextBase).super_TParseVersions.infoSink;
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
        pTVar8 = (TString *)(**(code **)(*plVar7 + 0x198))(plVar7);
        TIntermediate::addToCallGraph(this_00,name,&this->currentCaller,pTVar8);
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (((iVar4 == 0x14b) ||
            (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
            iVar4 == 0x14e)) ||
           (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar4 == 0x14f
           )) {
          pTVar1 = (this->super_TParseContextBase).symbolTable;
          plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          name = (TInfoSink *)(**(code **)(*plVar7 + 0x198))(plVar7);
          pTVar9 = TSymbolTable::find(pTVar1,(TString *)name,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar9->_vptr_TSymbol[7])(pTVar9);
          plVar7 = (long *)CONCAT44(extraout_var_01,iVar4);
          for (uVar17 = 0; iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7), (int)uVar17 < iVar4;
              uVar17 = uVar17 + 1) {
            name = (TInfoSink *)(ulong)uVar17;
            lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7);
            lVar10 = (**(code **)(**(long **)(lVar10 + 8) + 0x50))();
            if ((*(uint *)(lVar10 + 8) & 0x7f) != 0x13) {
              plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
              lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
              name = (TInfoSink *)loc;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"function parameters must all be qualified \'const in\'",
                         *(undefined8 *)(lVar10 + 8));
            }
          }
        }
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (iVar4 == 0x14b) {
          pTVar1 = (this->super_TParseContextBase).symbolTable;
          plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          pTVar8 = (TString *)(**(code **)(*plVar7 + 0x198))(plVar7);
          pTVar9 = TSymbolTable::find(pTVar1,pTVar8,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar9->_vptr_TSymbol[7])(pTVar9);
          plVar7 = (long *)CONCAT44(extraout_var_02,iVar4);
          iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7);
          if (iVar4 != 3) {
            plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
            lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must have three parameters",*(undefined8 *)(lVar10 + 8));
          }
          lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,0);
          iVar4 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
          if (iVar4 != 0x12) {
            plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
            lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"first parameter must be buffer reference type",
                       *(undefined8 *)(lVar10 + 8));
          }
          lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,1);
          iVar4 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
          if (iVar4 == 9) {
            lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,2);
            iVar4 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
            if (iVar4 != 9) goto LAB_0039c01e;
          }
          else {
LAB_0039c01e:
            plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
            lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"coordinate parameters must be uint32_t",*(undefined8 *)(lVar10 + 8)
                      );
          }
          lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,1);
          cVar2 = (**(code **)(**(long **)(lVar10 + 8) + 0xe8))();
          if (cVar2 != '\0') {
            name = (TInfoSink *)0x2;
            lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7);
            cVar2 = (**(code **)(**(long **)(lVar10 + 8) + 0xe8))();
            if (cVar2 != '\0') goto LAB_0039c0d6;
          }
          plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7);
          name = (TInfoSink *)loc;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"coordinate parameters must be uint32_t",*(undefined8 *)(lVar10 + 8));
        }
LAB_0039c0d6:
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (iVar4 == 0x14e) {
          pTVar1 = (this->super_TParseContextBase).symbolTable;
          plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          name = (TInfoSink *)(**(code **)(*plVar7 + 0x198))(plVar7);
          pTVar9 = TSymbolTable::find(pTVar1,(TString *)name,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar9->_vptr_TSymbol[7])(pTVar9);
          plVar7 = (long *)CONCAT44(extraout_var_03,iVar4);
          iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7);
          if (iVar4 != 2) {
            plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
            lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
            name = (TInfoSink *)loc;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"must have two parameters",*(undefined8 *)(lVar10 + 8));
          }
          for (uVar17 = 0; iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7), (int)uVar17 < iVar4;
              uVar17 = uVar17 + 1) {
            name = (TInfoSink *)(ulong)uVar17;
            lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7);
            plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
            plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
            iVar4 = (**(code **)(*plVar11 + 0x38))(plVar11);
            iVar5 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
            if (iVar4 != iVar5) {
              plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
              lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
              name = (TInfoSink *)loc;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"parameter types must match cooperative matrix component type",
                         *(undefined8 *)(lVar10 + 8));
            }
          }
          plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
          plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
          iVar4 = (**(code **)(*plVar11 + 0x38))(plVar11);
          plVar7 = (long *)(**(code **)(*plVar7 + 0x60))(plVar7);
          iVar5 = (**(code **)(*plVar7 + 0x38))(plVar7);
          if (iVar4 != iVar5) {
            plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
            lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7);
            name = (TInfoSink *)loc;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"return type must match cooperative matrix component type",
                       *(undefined8 *)(lVar10 + 8));
          }
        }
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (iVar4 == 0x14f) {
          pTVar1 = (this->super_TParseContextBase).symbolTable;
          plVar7 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          pTVar8 = (TString *)(**(code **)(*plVar7 + 0x198))(plVar7);
          pTVar9 = TSymbolTable::find(pTVar1,pTVar8,(bool *)0x0,(bool *)0x0,(int *)0x0);
          iVar4 = (*pTVar9->_vptr_TSymbol[7])(pTVar9);
          plVar7 = (long *)CONCAT44(extraout_var_04,iVar4);
          plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
          pTVar12 = (TType *)(**(code **)(*plVar11 + 0xf0))(plVar11);
          plVar11 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar6 + 8) + 0x18))();
          right = (TType *)(**(code **)(*plVar11 + 0xf0))(plVar11);
          bVar3 = TType::operator!=(pTVar12,right);
          if (bVar3) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cooperative matrix input and result types must match");
          }
          iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7);
          pcVar18 = "not enough parameters";
          if (2 < iVar4) {
            iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7);
            pcVar18 = "number of parameters must match call to coopMatPerElementNV";
            if (iVar4 == (int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 3)) {
              lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,0);
              iVar4 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
              if (iVar4 == 9) {
                lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7,1);
                iVar4 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
                if (iVar4 != 9) goto LAB_0039c3ee;
              }
              else {
LAB_0039c3ee:
                plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
                lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"row/column parameters must be uint32_t",
                           *(undefined8 *)(lVar10 + 8));
              }
              name = (TInfoSink *)0x2;
              lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7);
              plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
              plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
              iVar4 = (**(code **)(*plVar11 + 0x38))(plVar11);
              iVar5 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
              if (iVar4 != iVar5) {
                plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
                lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
                name = (TInfoSink *)loc;
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"third parameter must match cooperative matrix component type",
                           *(undefined8 *)(lVar10 + 8));
              }
              for (uVar19 = 3; iVar4 = (**(code **)(*plVar7 + 0x120))(plVar7),
                  (long)uVar19 < (long)iVar4; uVar19 = uVar19 + 1) {
                name = (TInfoSink *)(uVar19 & 0xffffffff);
                lVar10 = (**(code **)(*plVar7 + 0x140))(plVar7);
                plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + uVar19 * 8) + 0x18
                                              ))();
                plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
                iVar4 = (**(code **)(*plVar11 + 0x38))(plVar11);
                iVar5 = (**(code **)(**(long **)(lVar10 + 8) + 0x38))();
                if (iVar4 != iVar5) {
                  plVar11 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
                  lVar10 = (**(code **)(*plVar11 + 0x198))(plVar11);
                  name = (TInfoSink *)loc;
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,
                             "parameter types must match or be cooperative matrix component type",
                             *(undefined8 *)(lVar10 + 8));
                }
              }
              plVar11 = (long *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
              plVar11 = (long *)(**(code **)(*plVar11 + 0xf0))(plVar11);
              iVar4 = (**(code **)(*plVar11 + 0x38))(plVar11);
              plVar7 = (long *)(**(code **)(*plVar7 + 0x60))(plVar7);
              iVar5 = (**(code **)(*plVar7 + 0x38))(plVar7);
              pcVar18 = "return type must match cooperative matrix component type";
              if (iVar4 == iVar5) goto LAB_0039c5e3;
            }
          }
          plVar13 = (long *)(**(code **)(*plVar13 + 0x60))(plVar13);
          lVar10 = (**(code **)(*plVar13 + 0x198))(plVar13);
          name = (TInfoSink *)loc;
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,pcVar18,*(undefined8 *)(lVar10 + 8));
        }
      }
LAB_0039c5e3:
      uVar16 = uVar16 + 1;
    }
  }
  iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0xf0))
                    ((long *)CONCAT44(extraout_var_05,iVar4));
  if ((*(byte *)(lVar6 + 10) & 0x60) == 0) {
    iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0xf0))
                                ((long *)CONCAT44(extraout_var_06,iVar4));
    iVar4 = (**(code **)(*plVar13 + 0x38))(plVar13);
    if (iVar4 != 0x17) {
      iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0xf0))
                                  ((long *)CONCAT44(extraout_var_07,iVar4));
      iVar4 = (**(code **)(*plVar13 + 0x38))(plVar13);
      if (iVar4 != 0x18) {
        return;
      }
    }
  }
  iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0xf0))
                              ((long *)CONCAT44(extraout_var_08,iVar4));
  cVar2 = (**(code **)(*plVar13 + 0x188))(plVar13);
  if (cVar2 == '\0') {
    iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if ((((iVar4 != 0x148) &&
         (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar4 != 0x14d))
        && ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
            iVar4 != 0x14e &&
            ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 != 0x14f &&
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 != 0x150)))))) &&
       (((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar4 != 0x151
         && ((((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar4 != 0x153 &&
               (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar4 != 0x152)) &&
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 != 0x154)) &&
             ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 != 0x155 &&
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 != 0x156)))))) &&
        (((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar4 != 0x157
          && ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 != 0x158 &&
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 != 0x159)))) &&
         (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar4 != 0x15a))
        )))) {
      __assert_fail("fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV || fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV || fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x672,
                    "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                   );
    }
    iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if (iVar4 == 0x151) {
      pTVar14 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)name);
      (pTVar14->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
      (pTVar14->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar14->implicitArraySize = 0;
      pTVar14->implicitlySized = true;
      pTVar14->variablyIndexed = false;
      for (uVar19 = 0; uVar19 != 2; uVar19 = uVar19 + 1) {
        iVar4 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_09,iVar4) == 0) {
          iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_10,iVar4) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x67f,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 400))
                            ((long *)CONCAT44(extraout_var_11,iVar4));
          if (((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) >> 3) <= uVar19) ||
             (pTVar20 = *(TIntermNode **)(*(long *)(lVar6 + 8) + uVar19 * 8),
             pTVar20 == (TIntermNode *)0x0)) goto LAB_0039c8cb;
LAB_0039c88c:
          iVar4 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
          plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_12,iVar4));
          lVar6 = (**(code **)(*plVar13 + 0x58))(plVar13);
          if ((*(ulong *)(lVar6 + 8) & 0x100000000) == 0) {
            iVar4 = (*pTVar20->_vptr_TIntermNode[5])(pTVar20);
            iVar4 = **(int **)(*(long *)(CONCAT44(extraout_var_13,iVar4) + 0xc0) + 8);
            goto LAB_0039c8d0;
          }
          iVar4 = (*pTVar20->_vptr_TIntermNode[0xc])(pTVar20);
          uVar16 = **(uint **)(*(long *)(CONCAT44(extraout_var_14,iVar4) + 0x128) + 8);
          iVar4 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
          TSmallArrayVector::push_back
                    ((TSmallArrayVector *)pTVar14,uVar16,
                     (TIntermTyped *)CONCAT44(extraout_var_15,iVar4));
        }
        else {
          pTVar20 = arguments;
          if (uVar19 == 0) goto LAB_0039c88c;
LAB_0039c8cb:
          iVar4 = 0;
LAB_0039c8d0:
          TArraySizes::addInnerSize(pTVar14,iVar4);
        }
      }
      local_e0.basicType = EbtVoid;
      local_e0.spirvType = (TSpirvType *)0x0;
      local_e0.arraySizes = pTVar14;
      TType::TType(&resultType,EbtVoid,EvqTemporary,1,0,0,false);
      iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar12 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar4) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_23,iVar4));
      TType::deepCopy(&resultType,pTVar12);
      TType::copyTypeParameters(&resultType,&local_e0);
      pp_Var15 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    else {
      iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
      if (iVar4 != 0x157) {
        iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (((((iVar4 == 0x14e) ||
              (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 == 0x14f)) ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x150)) ||
            ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x153 ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x152)))) ||
           ((((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar4 == 0x154 ||
              ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar4 == 0x155 ||
               (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar4 == 0x156)))) ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x158)) ||
            ((iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x159 ||
             (iVar4 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar4 == 0x15a)))))) {
          iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar4) + 400))
                            ((long *)CONCAT44(extraout_var_24,iVar4));
          plVar13 = (long *)**(undefined8 **)(lVar6 + 8);
        }
        else {
          iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar4) + 400))
                            ((long *)CONCAT44(extraout_var_26,iVar4));
          plVar13 = *(long **)(*(long *)(lVar6 + 8) + 0x10);
        }
        plVar13 = (long *)(**(code **)(*plVar13 + 0x18))();
        auVar21 = (**(code **)(*plVar13 + 0xf0))(plVar13);
        UNRECOVERED_JUMPTABLE = (result->super_TIntermNode)._vptr_TIntermNode[0x1d];
        (*UNRECOVERED_JUMPTABLE)(result,auVar21._0_8_,auVar21._8_8_,UNRECOVERED_JUMPTABLE);
        return;
      }
      pTVar14 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)name);
      (pTVar14->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
      (pTVar14->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar14->implicitArraySize = 0;
      pTVar14->implicitlySized = true;
      pTVar14->variablyIndexed = false;
      for (uVar19 = 0; uVar19 != 7; uVar19 = uVar19 + 1) {
        iVar4 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_16,iVar4) == 0) {
          iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_17,iVar4) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x6a5,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar4 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar4) + 400))
                            ((long *)CONCAT44(extraout_var_18,iVar4));
          if (((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) >> 3) <= uVar19) ||
             (pTVar20 = *(TIntermNode **)(*(long *)(lVar6 + 8) + uVar19 * 8),
             pTVar20 == (TIntermNode *)0x0)) goto LAB_0039ca02;
LAB_0039c9c6:
          iVar4 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
          plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar4) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_19,iVar4));
          lVar6 = (**(code **)(*plVar13 + 0x58))(plVar13);
          if ((*(ulong *)(lVar6 + 8) & 0x100000000) == 0) {
            iVar4 = (*pTVar20->_vptr_TIntermNode[5])(pTVar20);
            iVar4 = **(int **)(*(long *)(CONCAT44(extraout_var_20,iVar4) + 0xc0) + 8);
            goto LAB_0039ca0e;
          }
          iVar4 = (*pTVar20->_vptr_TIntermNode[0xc])(pTVar20);
          uVar16 = **(uint **)(*(long *)(CONCAT44(extraout_var_21,iVar4) + 0x128) + 8);
          iVar4 = (*pTVar20->_vptr_TIntermNode[3])(pTVar20);
          TSmallArrayVector::push_back
                    ((TSmallArrayVector *)pTVar14,uVar16,
                     (TIntermTyped *)CONCAT44(extraout_var_22,iVar4));
        }
        else {
          pTVar20 = arguments;
          if (uVar19 == 0) goto LAB_0039c9c6;
LAB_0039ca02:
          iVar4 = (int)uVar19 + -2;
          if (uVar19 < 2) {
            iVar4 = 0;
          }
LAB_0039ca0e:
          TArraySizes::addInnerSize(pTVar14,iVar4);
        }
      }
      local_e0.basicType = EbtVoid;
      local_e0.spirvType = (TSpirvType *)0x0;
      local_e0.arraySizes = pTVar14;
      TType::TType(&resultType,EbtVoid,EvqTemporary,1,0,0,false);
      iVar4 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar12 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar4) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_25,iVar4));
      TType::deepCopy(&resultType,pTVar12);
      TType::copyTypeParameters(&resultType,&local_e0);
      pp_Var15 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    (*pp_Var15[0x1d])(result,&resultType);
  }
  return;
}

Assistant:

void TParseContext::handleCoopMat2FunctionCall(const TSourceLoc& loc, const TFunction* fnCandidate, TIntermTyped* result, TIntermNode* arguments)
{
    if (arguments && arguments->getAsAggregate()) {
        auto &sequence = arguments->getAsAggregate()->getSequence();
        for (uint32_t i = 0; i < sequence.size(); ++i) {
            auto param = sequence[i];
            if (param->getAsTyped()->getBasicType() == EbtFunction) {
                // Add the function to the callgraph
                intermediate.addToCallGraph(infoSink, currentCaller, param->getAsSymbolNode()->getMangledName());

                // error checking that all parameters are 'const in'
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* func = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();
                    for (int i = 0; i < func->getParamCount(); ++i) {
                        const TParameter& arg = (*func)[i];
                        const TQualifier& formalQualifier = arg.type->getQualifier();
                        if (formalQualifier.storage != EvqConstReadOnly) {
                            error(loc, "function parameters must all be qualified 'const in'", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }

                // error checking decodeFunc parameters are (reference, uint32_t[], uint32_t[])
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV) {
                    const TFunction* decodeFunc = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (decodeFunc->getParamCount() != 3) {
                        error(loc, "must have three parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    if ((*decodeFunc)[0].type->getBasicType() != EbtReference) {
                        error(loc, "first parameter must be buffer reference type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if ((*decodeFunc)[1].type->getBasicType() != EbtUint || (*decodeFunc)[2].type->getBasicType() != EbtUint) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if (!(*decodeFunc)[1].type->isArray() || !(*decodeFunc)[2].type->isArray()) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking reduce function has matching parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV) {
                    const TFunction* combineOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (combineOp->getParamCount() != 2) {
                        error(loc, "must have two parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    for (int i = 0; i < combineOp->getParamCount(); ++i) {
                        const TParameter& arg = (*combineOp)[i];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                            error(loc, "parameter types must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                    if (sequence[1]->getAsTyped()->getType().getBasicType() != combineOp->getType().getBasicType()) {
                        error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking perelement op has correct parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* elemOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (sequence[1]->getAsTyped()->getType() != sequence[0]->getAsTyped()->getType()) {
                        error(loc, "cooperative matrix input and result types must match", "", "");
                    }

                    if (elemOp->getParamCount() < 3) {
                        error(loc, "not enough parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else if (elemOp->getParamCount() != (int)sequence.size()) {
                        error(loc, "number of parameters must match call to coopMatPerElementNV", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else {
                        if ((*elemOp)[0].type->getBasicType() != EbtUint || (*elemOp)[1].type->getBasicType() != EbtUint) {
                            error(loc, "row/column parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        const TParameter& matArg = (*elemOp)[2];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != matArg.type->getBasicType()) {
                            error(loc, "third parameter must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        for (int i = 3; i < elemOp->getParamCount(); ++i) {
                            const TParameter& arg = (*elemOp)[i];
                            if (sequence[i]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                                error(loc, "parameter types must match or be cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                            }
                        }
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != elemOp->getType().getBasicType()) {
                            error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }
            }
        }
    }
    if ((result->getAsTyped()->getType().isCoopMat() ||
         result->getAsTyped()->getType().isTensorLayoutNV() ||
         result->getAsTyped()->getType().isTensorViewNV()) &&
       !result->getAsTyped()->getType().isParameterized()) {
        assert(fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV);

        if (fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 2; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    // gl_CooperativeMatrixClampModeUndefined
                    arraySizes->addInnerSize(0);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 7; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    uint32_t value = 0;
                    if (i >= 2) {
                        // default permutation values are an increasing sequence
                        value = i - 2;
                    }
                    arraySizes->addInnerSize(value);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV) {
            // Set result type to match type of first parameter
            result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
        } else {
            // For MulAdd, set result type to match type of C parameter
            result->setType(result->getAsAggregate()->getSequence()[2]->getAsTyped()->getType());
        }
    }
}